

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O2

MatrixGraph newEmptyMatrixGraph(int countOfVertex,int countOfEdge)

{
  uint __line;
  MatrixGraph pAVar1;
  VertexType *pVVar2;
  int **ppiVar3;
  int *piVar4;
  int i;
  int j;
  ulong uVar5;
  char *__assertion;
  size_t __size;
  ulong uVar6;
  ulong uVar7;
  
  pAVar1 = (MatrixGraph)malloc(0x20);
  if (pAVar1 == (MatrixGraph)0x0) {
    __assertion = "matrixGraph";
    __line = 0x3c;
  }
  else {
    __size = (size_t)countOfVertex;
    pVVar2 = (VertexType *)malloc(__size);
    pAVar1->vertex = pVVar2;
    ppiVar3 = (int **)malloc(__size * 8);
    pAVar1->matrix = ppiVar3;
    if (ppiVar3 == (int **)0x0) {
      __assertion = "matrixGraph->matrix";
      __line = 0x40;
    }
    else {
      uVar7 = 0;
      uVar6 = 0;
      if (0 < countOfVertex) {
        uVar6 = (ulong)(uint)countOfVertex;
      }
      do {
        if (uVar6 == uVar7) {
          pAVar1->vexNum = countOfVertex;
          pAVar1->edgeNum = countOfEdge;
          for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
            for (uVar5 = 0; (uint)countOfVertex != uVar5; uVar5 = uVar5 + 1) {
              ppiVar3[uVar7][uVar5] = 0x7fff;
            }
          }
          return pAVar1;
        }
        piVar4 = (int *)malloc(__size * 4);
        ppiVar3[uVar7] = piVar4;
        uVar7 = uVar7 + 1;
      } while (piVar4 != (int *)0x0);
      __assertion = "matrixGraph->matrix[i]";
      __line = 0x43;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                ,__line,"MatrixGraph newEmptyMatrixGraph(int, int)");
}

Assistant:

MatrixGraph newEmptyMatrixGraph(int countOfVertex, int countOfEdge) {
    MatrixGraph matrixGraph = malloc(sizeof(struct AMG));
    assert(matrixGraph);

    matrixGraph->vertex = malloc(sizeof(VertexType) * countOfVertex);
    matrixGraph->matrix = malloc(sizeof(int *) * countOfVertex);
    assert(matrixGraph->matrix);
    for (int i = 0; i < countOfVertex; ++i) {
        matrixGraph->matrix[i] = malloc(sizeof(int) * countOfVertex);
        assert(matrixGraph->matrix[i]);
    }


    matrixGraph->vexNum = countOfVertex;
    matrixGraph->edgeNum = countOfEdge;

    // 初始化矩阵
    for (int i = 0; i < countOfVertex; ++i) {
        for (int j = 0; j < countOfVertex; ++j) {
            matrixGraph->matrix[i][j] = UNFLAG_WEIGHT_GRAPH;
        }
    }

    return matrixGraph;
}